

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructuresOperators.cpp
# Opt level: O0

ostream * operator<<(ostream *outs,RGB rgb)

{
  ostream *poVar1;
  ostream *outs_local;
  RGB rgb_local;
  
  outs_local._5_1_ = rgb.r;
  poVar1 = (ostream *)std::ostream::operator<<(outs,(uint)outs_local._5_1_);
  poVar1 = std::operator<<(poVar1," ");
  outs_local._6_1_ = rgb.g;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)outs_local._6_1_);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,(uint)rgb.b);
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, RGB rgb)
{
  outs << static_cast<int>(rgb.r) << " " << static_cast<int>(rgb.g) << " "
       << static_cast<int>(rgb.b);
  return outs;
}